

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

aiMatrix4x4 * __thiscall
Assimp::X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent
          (aiMatrix4x4 *__return_storage_ptr__,X3DImporter *this)

{
  bool bVar1;
  reference m;
  aiMatrix4x4t<float> local_90;
  undefined1 local_50 [16];
  reverse_iterator rit;
  undefined1 local_30 [8];
  list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> matr;
  CX3DImporter_NodeElement *cur_node;
  X3DImporter *this_local;
  
  std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::list
            ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_30);
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl._M_node.
  _M_size = (size_t)this->NodeElement_Cur;
  if ((CX3DImporter_NodeElement *)
      matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
      _M_node._M_size != (CX3DImporter_NodeElement *)0x0) {
    do {
      if (*(int *)(matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                   ._M_impl._M_node._M_size + 8) == 0) {
        std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_30,
                   (value_type *)
                   (matr.
                    super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                    _M_impl._M_node._M_size + 0x50));
      }
      matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
      _M_node._M_size =
           *(size_t *)
            (matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
             _M_impl._M_node._M_size + 0x30);
    } while (matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
             _M_impl._M_node._M_size != 0);
    matr.super__List_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
    _M_node._M_size = 0;
  }
  std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::rbegin
            ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)(local_50 + 8));
  while( true ) {
    std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::rend
              ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_50);
    bVar1 = std::operator!=((reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_> *)
                            (local_50 + 8),
                            (reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_> *)local_50
                           );
    if (!bVar1) break;
    m = std::reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_>::operator*
                  ((reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_> *)(local_50 + 8));
    aiMatrix4x4t<float>::operator*(&local_90,__return_storage_ptr__,m);
    memcpy(__return_storage_ptr__,&local_90,0x40);
    std::reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_>::operator++
              ((reverse_iterator<std::_List_iterator<aiMatrix4x4t<float>_>_> *)(local_50 + 8));
  }
  std::__cxx11::list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~list
            ((list<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 X3DImporter::PostprocessHelper_Matrix_GlobalToCurrent() const
{
    CX3DImporter_NodeElement* cur_node;
    std::list<aiMatrix4x4> matr;
    aiMatrix4x4 out_matr;

	// starting walk from current element to root
	cur_node = NodeElement_Cur;
	if(cur_node != nullptr)
	{
		do
		{
			// if cur_node is group then store group transformation matrix in list.
			if(cur_node->Type == CX3DImporter_NodeElement::ENET_Group) matr.push_back(((CX3DImporter_NodeElement_Group*)cur_node)->Transformation);

			cur_node = cur_node->Parent;
		} while(cur_node != nullptr);
	}

	// multiplicate all matrices in reverse order
	for(std::list<aiMatrix4x4>::reverse_iterator rit = matr.rbegin(); rit != matr.rend(); ++rit) out_matr = out_matr * (*rit);

	return out_matr;
}